

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

void __thiscall
leveldb::MemTable::Add(MemTable *this,SequenceNumber s,ValueType type,Slice *key,Slice *value)

{
  long lVar1;
  int iVar2;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *pSVar3;
  char **key_00;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *__src;
  char *pcVar7;
  char *in_RDI;
  long in_FS_OFFSET;
  char *p;
  size_t encoded_len;
  size_t internal_key_size;
  size_t val_size;
  size_t key_size;
  char *buf;
  Slice *in_stack_ffffffffffffff78;
  Arena *in_stack_ffffffffffffff90;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar3 = (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)
           Slice::size(in_stack_ffffffffffffff78);
  key_00 = (char **)Slice::size(in_stack_ffffffffffffff78);
  this_00 = pSVar3;
  iVar2 = VarintLength((uint64_t)in_stack_ffffffffffffff78);
  pcVar7 = (char *)((long)&(pSVar3->compare_).comparator.user_comparator_ + (long)iVar2);
  iVar2 = VarintLength((uint64_t)in_stack_ffffffffffffff78);
  pcVar4 = pcVar7 + iVar2 + (long)key_00;
  pcVar5 = Arena::Allocate(in_stack_ffffffffffffff90,(size_t)pcVar7);
  pcVar6 = EncodeVarint32(pcVar7,(uint32_t)((ulong)in_RDI >> 0x20));
  __src = Slice::data(in_stack_ffffffffffffff78);
  memcpy(pcVar6,__src,(size_t)this_00);
  EncodeFixed64(in_RDI,(uint64_t)pcVar7);
  pcVar7 = EncodeVarint32(pcVar7,(uint32_t)((ulong)in_RDI >> 0x20));
  pcVar6 = Slice::data(in_stack_ffffffffffffff78);
  memcpy(pcVar7,pcVar6,(size_t)key_00);
  if (pcVar7 + (long)key_00 != pcVar5 + (long)pcVar4) {
    __assert_fail("p + val_size == buf + encoded_len",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/memtable.cc"
                  ,0x61,
                  "void leveldb::MemTable::Add(SequenceNumber, ValueType, const Slice &, const Slice &)"
                 );
  }
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Insert(this_00,key_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MemTable::Add(SequenceNumber s, ValueType type, const Slice& key,
                   const Slice& value) {
  // Format of an entry is concatenation of:
  //  key_size     : varint32 of internal_key.size()
  //  key bytes    : char[internal_key.size()]
  //  value_size   : varint32 of value.size()
  //  value bytes  : char[value.size()]
  size_t key_size = key.size();
  size_t val_size = value.size();
  size_t internal_key_size = key_size + 8;
  const size_t encoded_len = VarintLength(internal_key_size) +
                             internal_key_size + VarintLength(val_size) +
                             val_size;
  char* buf = arena_.Allocate(encoded_len);
  char* p = EncodeVarint32(buf, internal_key_size);
  memcpy(p, key.data(), key_size);
  p += key_size;
  EncodeFixed64(p, (s << 8) | type);
  p += 8;
  p = EncodeVarint32(p, val_size);
  memcpy(p, value.data(), val_size);
  assert(p + val_size == buf + encoded_len);
  table_.Insert(buf);
}